

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::WriteDisclaimer(cmGlobalNinjaGenerator *this,ostream *os)

{
  uint uVar1;
  ostream *poVar2;
  string local_38 [32];
  ostream *local_18;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  poVar2 = std::operator<<(os,"# CMAKE generated file: DO NOT EDIT!\n");
  poVar2 = std::operator<<(poVar2,"# Generated by \"");
  (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[2])();
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2," Generator, CMake Version ");
  uVar1 = cmVersion::GetMajorVersion();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,".");
  uVar1 = cmVersion::GetMinorVersion();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2,"\n\n");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteDisclaimer(std::ostream& os)
{
  os
    << "# CMAKE generated file: DO NOT EDIT!\n"
    << "# Generated by \"" << this->GetName() << "\""
    << " Generator, CMake Version "
    << cmVersion::GetMajorVersion() << "."
    << cmVersion::GetMinorVersion() << "\n\n";
}